

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarray.c
# Opt level: O3

void tommy_array_grow(tommy_array *array,tommy_count_t count)

{
  long lVar1;
  void *pvVar2;
  tommy_uint_t tVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (array->count < count) {
    array->count = count;
    uVar4 = array->bucket_max;
    while (uVar4 < count) {
      pvVar2 = lrtr_calloc((ulong)uVar4,8);
      tVar3 = array->bucket_bit + 1;
      uVar4 = 1 << ((byte)tVar3 & 0x1f);
      array->bucket[array->bucket_bit] = (void **)((long)pvVar2 + (ulong)array->bucket_max * -8);
      array->bucket_bit = tVar3;
      array->bucket_max = uVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_array_grow(tommy_array* array, tommy_count_t count)
{
	if (array->count >= count)
		return;
	array->count = count;

	while (count > array->bucket_max) {
		void** segment;

		/* allocate one more segment */
		segment = tommy_cast(void**, tommy_calloc(array->bucket_max, sizeof(void*)));

		/* store it adjusting the offset */
		/* cast to ptrdiff_t to ensure to get a negative value */
		array->bucket[array->bucket_bit] = &segment[-(tommy_ptrdiff_t)array->bucket_max];

		++array->bucket_bit;
		array->bucket_max = 1 << array->bucket_bit;
	}
}